

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::visitClassDecl(CheckerVisitor *this,ClassDecl *klass)

{
  pointer *ppSVar1;
  StackSlot local_20;
  
  local_20.sst = SST_NODE;
  local_20.field_1 = (anon_union_8_2_108c9717_for_StackSlot_1)klass;
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::emplace_back<SQCompilation::CheckerVisitor::StackSlot>(&this->nodeStack,&local_20);
  if (&klass->_key->super_Node != (Node *)0x0) {
    Node::visit<SQCompilation::CheckerVisitor>(&klass->_key->super_Node,this);
  }
  if (&klass->_base->super_Node != (Node *)0x0) {
    Node::visit<SQCompilation::CheckerVisitor>(&klass->_base->super_Node,this);
  }
  (*(this->super_Visitor)._vptr_Visitor[0x2d])(this,klass);
  ppSVar1 = &(this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppSVar1 = *ppSVar1 + -1;
  return;
}

Assistant:

void CheckerVisitor::visitClassDecl(ClassDecl *klass) {
  nodeStack.push_back({ SST_NODE, klass });

  if (klass->classKey())
    klass->classKey()->visit(this);

  if (klass->classBase())
    klass->classBase()->visit(this);

  visitTableDecl(klass);

  nodeStack.pop_back();
}